

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSenderTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::utils::UDPSender_testZipkinMessage_Test::~UDPSender_testZipkinMessage_Test
          (UDPSender_testZipkinMessage_Test *this)

{
  UDPSender_testZipkinMessage_Test *this_local;
  
  ~UDPSender_testZipkinMessage_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(UDPSender, testZipkinMessage)
{
    net::IPAddress serverAddr;
    std::promise<void> started;
    std::thread serverThread([&serverAddr, &started]() {
        net::Socket socket;
        socket.open(AF_INET, SOCK_DGRAM);
        socket.bind(net::IPAddress::v4("127.0.0.1", 0));
        ::sockaddr_storage addrStorage;
        ::socklen_t addrLen = sizeof(addrStorage);
        const auto returnCode =
            ::getsockname(socket.handle(),
                          reinterpret_cast<::sockaddr*>(&addrStorage),
                          &addrLen);
        ASSERT_EQ(0, returnCode);
        serverAddr = net::IPAddress(addrStorage, addrLen);
        started.set_value();
    });

    started.get_future().wait();
    UDPTransporter udpClient(serverAddr, 0);
    using ZipkinBatch = std::vector<twitter::zipkin::thrift::Span>;
    ASSERT_THROW(udpClient.emitZipkinBatch(ZipkinBatch()), std::logic_error);
    serverThread.join();
}